

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTcpServer.cpp
# Opt level: O0

void __thiscall xs::TcpServer::~TcpServer(TcpServer *this)

{
  bool bVar1;
  deSocketState dVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  reference ppCVar6;
  int __fd;
  insert_iterator<std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
  iVar7;
  __normal_iterator<xs::ConnectionHandler_**,_std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
  local_c0;
  __normal_iterator<xs::ConnectionHandler_**,_std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
  local_b8;
  __normal_iterator<xs::ConnectionHandler_*const_*,_std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
  local_b0;
  const_iterator i;
  undefined1 local_28 [8];
  vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_> allConnections;
  TcpServer *this_local;
  __normal_iterator<xs::ConnectionHandler_**,_std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
  *__rhs;
  
  this->_vptr_TcpServer = (_func_int **)&PTR__TcpServer_0015f910;
  allConnections.
  super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::vector
            ((vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_> *)local_28);
  bVar1 = de::Mutex::tryLock(&this->m_connectionListLock);
  if (bVar1) {
    iVar3 = std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::begin
                      (&this->m_liveConnections);
    iVar4 = std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::end
                      (&this->m_liveConnections);
    iVar5 = std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::end
                      ((vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_> *)
                       local_28);
    iVar7 = std::
            inserter<std::vector<xs::ConnectionHandler*,std::allocator<xs::ConnectionHandler*>>>
                      ((vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_> *)
                       local_28,iVar5);
    std::
    copy<__gnu_cxx::__normal_iterator<xs::ConnectionHandler**,std::vector<xs::ConnectionHandler*,std::allocator<xs::ConnectionHandler*>>>,std::insert_iterator<std::vector<xs::ConnectionHandler*,std::allocator<xs::ConnectionHandler*>>>>
              ((__normal_iterator<xs::ConnectionHandler_**,_std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
                )iVar3._M_current,
               (__normal_iterator<xs::ConnectionHandler_**,_std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
                )iVar4._M_current,iVar7);
    iVar3 = std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::begin
                      (&this->m_doneConnections);
    iVar4 = std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::end
                      (&this->m_doneConnections);
    iVar5 = std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::end
                      ((vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_> *)
                       local_28);
    iVar7 = std::
            inserter<std::vector<xs::ConnectionHandler*,std::allocator<xs::ConnectionHandler*>>>
                      ((vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_> *)
                       local_28,iVar5);
    iVar7 = std::
            copy<__gnu_cxx::__normal_iterator<xs::ConnectionHandler**,std::vector<xs::ConnectionHandler*,std::allocator<xs::ConnectionHandler*>>>,std::insert_iterator<std::vector<xs::ConnectionHandler*,std::allocator<xs::ConnectionHandler*>>>>
                      ((__normal_iterator<xs::ConnectionHandler_**,_std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
                        )iVar3._M_current,
                       (__normal_iterator<xs::ConnectionHandler_**,_std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
                        )iVar4._M_current,iVar7);
    i._M_current = (ConnectionHandler **)iVar7.container;
    de::Mutex::unlock(&this->m_connectionListLock);
  }
  local_b8._M_current =
       (ConnectionHandler **)
       std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::begin
                 ((vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_> *)
                  local_28);
  __gnu_cxx::
  __normal_iterator<xs::ConnectionHandler*const*,std::vector<xs::ConnectionHandler*,std::allocator<xs::ConnectionHandler*>>>
  ::__normal_iterator<xs::ConnectionHandler**>
            ((__normal_iterator<xs::ConnectionHandler*const*,std::vector<xs::ConnectionHandler*,std::allocator<xs::ConnectionHandler*>>>
              *)&local_b0,&local_b8);
  while( true ) {
    local_c0._M_current =
         (ConnectionHandler **)
         std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::end
                   ((vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_> *)
                    local_28);
    __rhs = &local_c0;
    bVar1 = __gnu_cxx::operator!=(&local_b0,__rhs);
    __fd = (int)__rhs;
    if (!bVar1) break;
    ppCVar6 = __gnu_cxx::
              __normal_iterator<xs::ConnectionHandler_*const_*,_std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
              ::operator*(&local_b0);
    if (*ppCVar6 != (ConnectionHandler *)0x0) {
      (*((*ppCVar6)->super_Thread)._vptr_Thread[1])();
    }
    __gnu_cxx::
    __normal_iterator<xs::ConnectionHandler_*const_*,_std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>_>
    ::operator++(&local_b0,0);
  }
  dVar2 = de::Socket::getState(&this->m_socket);
  if (dVar2 != DE_SOCKETSTATE_CLOSED) {
    de::Socket::close(&this->m_socket,__fd);
  }
  std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::~vector
            ((vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_> *)local_28);
  std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::~vector
            (&this->m_doneConnections);
  std::vector<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>::~vector
            (&this->m_liveConnections);
  de::Mutex::~Mutex(&this->m_connectionListLock);
  de::Socket::~Socket(&this->m_socket);
  return;
}

Assistant:

TcpServer::~TcpServer (void)
{
	try
	{
		std::vector<ConnectionHandler*> allConnections;

		if (m_connectionListLock.tryLock())
		{
			// \note [pyry] It is possible that cleanup actually fails.
			try
			{
				std::copy(m_liveConnections.begin(), m_liveConnections.end(), std::inserter(allConnections, allConnections.end()));
				std::copy(m_doneConnections.begin(), m_doneConnections.end(), std::inserter(allConnections, allConnections.end()));
			}
			catch (...)
			{
			}
			m_connectionListLock.unlock();
		}

		for (std::vector<ConnectionHandler*>::const_iterator i = allConnections.begin(); i != allConnections.end(); i++)
			delete *i;

		if (m_socket.getState() != DE_SOCKETSTATE_CLOSED)
			m_socket.close();
	}
	catch (...)
	{
		// Nada, we're at destructor.
	}
}